

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

EmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitUnaryExpr
          (WasmBytecodeGenerator *this,OpCodeAsmJs op,WasmType *signature)

{
  RegSlot location_;
  WasmRegisterSpace *this_00;
  EmitInfo EStack_38;
  RegSlot resultReg;
  EmitInfo info;
  WasmType inputType;
  WasmType resultType;
  WasmType *signature_local;
  OpCodeAsmJs op_local;
  WasmBytecodeGenerator *this_local;
  
  info.type = *signature;
  info.super_EmitInfoBase.location = signature[1];
  EStack_38 = PopEvalStack(this,info.super_EmitInfoBase.location,(char16 *)0x0);
  ReleaseLocation(this,&stack0xffffffffffffffc8);
  if (info.type == Void) {
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
              (this->m_writer,(ulong)op,0,(ulong)EStack_38 & 0xffffffff);
    EmitInfo::EmitInfo((EmitInfo *)&this_local);
  }
  else {
    this_00 = GetRegisterSpace(this,info.type);
    location_ = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
              (this->m_writer,(ulong)op,(ulong)location_,(ulong)EStack_38 & 0xffffffff);
    EmitInfo::EmitInfo((EmitInfo *)&this_local,location_,&info.type);
  }
  return (EmitInfo)this_local;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitUnaryExpr(Js::OpCodeAsmJs op, const WasmTypes::WasmType* signature)
{
    WasmTypes::WasmType resultType = signature[0];
    WasmTypes::WasmType inputType = signature[1];

    EmitInfo info = PopEvalStack(inputType);

    ReleaseLocation(&info);
    if (resultType == WasmTypes::Void)
    {
        m_writer->AsmReg2(op, 0, info.location);
        return EmitInfo();
    }

    Js::RegSlot resultReg = GetRegisterSpace(resultType)->AcquireTmpRegister();

    m_writer->AsmReg2(op, resultReg, info.location);

    return EmitInfo(resultReg, resultType);
}